

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O0

int __thiscall
CVmObjFile::getp_unpackBytes(CVmObjFile *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  char *pcVar2;
  int *in_RCX;
  CVmObjFile *in_RDI;
  CVmDataSource *in_stack_00000008;
  size_t in_stack_00000010;
  char *in_stack_00000018;
  vm_val_t *in_stack_00000020;
  size_t fmtlen;
  char *fmt;
  uint argc;
  vm_val_t *in_stack_ffffffffffffff88;
  vm_obj_id_t obj;
  CVmRun *in_stack_ffffffffffffff90;
  vm_val_t *in_stack_ffffffffffffff98;
  int local_5c;
  
  if (in_RCX == (int *)0x0) {
    local_5c = 0;
  }
  else {
    local_5c = *in_RCX;
  }
  if ((getp_unpackBytes(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_unpackBytes(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_unpackBytes::desc,1);
    __cxa_guard_release(&getp_unpackBytes(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff98,(uint *)in_stack_ffffffffffffff90,
                     (CVmNativeCodeDesc *)in_stack_ffffffffffffff88);
  if (iVar1 == 0) {
    check_raw_read((CVmObjFile *)in_stack_ffffffffffffff90);
    CVmStack::get(0);
    pcVar2 = vm_val_t::get_as_string(in_stack_ffffffffffffff88);
    obj = (vm_obj_id_t)((ulong)in_stack_ffffffffffffff88 >> 0x20);
    if (pcVar2 == (char *)0x0) {
      err_throw(0);
    }
    vmb_get_len((char *)0x2e1bf2);
    CVmRun::push_obj(in_stack_ffffffffffffff90,obj);
    get_ext(in_RDI);
    CVmPack::unpack(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008);
    CVmStack::discard(local_5c + 1);
  }
  return 1;
}

Assistant:

int CVmObjFile::getp_unpackBytes(VMG_ vm_obj_id_t self,
                                 vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* check that the it's a valid file open with read access in "raw" mode */
    check_raw_read(vmg0_);

    /* get the format string, but leave it on the stack */
    const char *fmt = G_stk->get(0)->get_as_string(vmg0_);
    if (fmt == 0)
        err_throw(VMERR_BAD_TYPE_BIF);

    /* get the format string pointer and length */
    size_t fmtlen = vmb_get_len(fmt);
    fmt += VMB_LEN;

    /* save 'self' for gc protection */
    G_stk->push_obj(vmg_ self);

    /* unpack the data from our file stream into a list, returning the list */
    CVmPack::unpack(vmg_ retval, fmt, fmtlen, get_ext()->fp);

    /* discard our arguments and gc protection */
    G_stk->discard(argc + 1);
        
    /* handled */
    return TRUE;
}